

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowCodeRangeTest(WindowCodeArg *p,int op,int csr1,int regVal,int csr2,int lbl)

{
  Parse *pParse_00;
  ExprList *pEVar1;
  int reg;
  int reg_00;
  int iVar2;
  int p2;
  int addr_00;
  Vdbe *p_00;
  CollSeq *pP4;
  int local_7c;
  int addr;
  CollSeq *pColl;
  int addrDone;
  int addrGe;
  int arith;
  int regString;
  int reg2;
  int reg1;
  ExprList *pOrderBy;
  Vdbe *v;
  Parse *pParse;
  int lbl_local;
  int csr2_local;
  int regVal_local;
  int csr1_local;
  int op_local;
  WindowCodeArg *p_local;
  
  pParse_00 = p->pParse;
  p_00 = sqlite3GetVdbe(pParse_00);
  pEVar1 = p->pMWin->pOrderBy;
  reg = sqlite3GetTempReg(pParse_00);
  reg_00 = sqlite3GetTempReg(pParse_00);
  iVar2 = pParse_00->nMem + 1;
  pParse_00->nMem = iVar2;
  addrDone = 0x6a;
  p2 = sqlite3VdbeMakeLabel(pParse_00);
  windowReadPeerValues(p,csr1,reg);
  windowReadPeerValues(p,csr2,reg_00);
  regVal_local = op;
  if ((pEVar1->a[0].fg.sortFlags & 1) != 0) {
    if (op == 0x36) {
      regVal_local = 0x38;
    }
    else if (op == 0x39) {
      regVal_local = 0x37;
    }
    else {
      regVal_local = 0x39;
    }
    addrDone = 0x6b;
  }
  if ((pEVar1->a[0].fg.sortFlags & 2) != 0) {
    addr_00 = sqlite3VdbeAddOp1(p_00,0x33,reg);
    if (regVal_local == 0x36) {
      sqlite3VdbeAddOp2(p_00,0x33,reg_00,lbl);
    }
    else if (regVal_local == 0x37) {
      sqlite3VdbeAddOp2(p_00,0x32,reg_00,lbl);
    }
    else if (regVal_local == 0x39) {
      sqlite3VdbeAddOp2(p_00,9,0,lbl);
    }
    sqlite3VdbeAddOp2(p_00,9,0,p2);
    sqlite3VdbeJumpHere(p_00,addr_00);
    local_7c = p2;
    if ((regVal_local != 0x36) && (regVal_local != 0x39)) {
      local_7c = lbl;
    }
    sqlite3VdbeAddOp2(p_00,0x32,reg_00,local_7c);
  }
  sqlite3VdbeAddOp4(p_00,0x75,0,iVar2,0,"",-1);
  iVar2 = sqlite3VdbeAddOp3(p_00,0x39,iVar2,0,reg);
  if (((regVal_local == 0x39) && (addrDone == 0x6a)) ||
     ((regVal_local == 0x37 && (addrDone == 0x6b)))) {
    sqlite3VdbeAddOp3(p_00,regVal_local,reg_00,lbl,reg);
  }
  sqlite3VdbeAddOp3(p_00,addrDone,regVal,reg,reg);
  sqlite3VdbeJumpHere(p_00,iVar2);
  sqlite3VdbeAddOp3(p_00,regVal_local,reg_00,lbl,reg);
  pP4 = sqlite3ExprNNCollSeq(pParse_00,pEVar1->a[0].pExpr);
  sqlite3VdbeAppendP4(p_00,pP4,-2);
  sqlite3VdbeChangeP5(p_00,0x80);
  sqlite3VdbeResolveLabel(p_00,p2);
  sqlite3ReleaseTempReg(pParse_00,reg);
  sqlite3ReleaseTempReg(pParse_00,reg_00);
  return;
}

Assistant:

static void windowCodeRangeTest(
  WindowCodeArg *p,
  int op,                         /* OP_Ge, OP_Gt, or OP_Le */
  int csr1,                       /* Cursor number for cursor 1 */
  int regVal,                     /* Register containing non-negative number */
  int csr2,                       /* Cursor number for cursor 2 */
  int lbl                         /* Jump destination if condition is true */
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  ExprList *pOrderBy = p->pMWin->pOrderBy;  /* ORDER BY clause for window */
  int reg1 = sqlite3GetTempReg(pParse);     /* Reg. for csr1.peerVal+regVal */
  int reg2 = sqlite3GetTempReg(pParse);     /* Reg. for csr2.peerVal */
  int regString = ++pParse->nMem;           /* Reg. for constant value '' */
  int arith = OP_Add;                       /* OP_Add or OP_Subtract */
  int addrGe;                               /* Jump destination */
  int addrDone = sqlite3VdbeMakeLabel(pParse);   /* Address past OP_Ge */
  CollSeq *pColl;

  /* Read the peer-value from each cursor into a register */
  windowReadPeerValues(p, csr1, reg1);
  windowReadPeerValues(p, csr2, reg2);

  assert( op==OP_Ge || op==OP_Gt || op==OP_Le );
  assert( pOrderBy && pOrderBy->nExpr==1 );
  if( pOrderBy->a[0].fg.sortFlags & KEYINFO_ORDER_DESC ){
    switch( op ){
      case OP_Ge: op = OP_Le; break;
      case OP_Gt: op = OP_Lt; break;
      default: assert( op==OP_Le ); op = OP_Ge; break;
    }
    arith = OP_Subtract;
  }

  VdbeModuleComment((v, "CodeRangeTest: if( R%d %s R%d %s R%d ) goto lbl",
      reg1, (arith==OP_Add ? "+" : "-"), regVal,
      ((op==OP_Ge) ? ">=" : (op==OP_Le) ? "<=" : (op==OP_Gt) ? ">" : "<"), reg2
  ));

  /* If the BIGNULL flag is set for the ORDER BY, then it is required to
  ** consider NULL values to be larger than all other values, instead of
  ** the usual smaller. The VDBE opcodes OP_Ge and so on do not handle this
  ** (and adding that capability causes a performance regression), so
  ** instead if the BIGNULL flag is set then cases where either reg1 or
  ** reg2 are NULL are handled separately in the following block. The code
  ** generated is equivalent to:
  **
  **   if( reg1 IS NULL ){
  **     if( op==OP_Ge ) goto lbl;
  **     if( op==OP_Gt && reg2 IS NOT NULL ) goto lbl;
  **     if( op==OP_Le && reg2 IS NULL ) goto lbl;
  **   }else if( reg2 IS NULL ){
  **     if( op==OP_Le ) goto lbl;
  **   }
  **
  ** Additionally, if either reg1 or reg2 are NULL but the jump to lbl is
  ** not taken, control jumps over the comparison operator coded below this
  ** block.  */
  if( pOrderBy->a[0].fg.sortFlags & KEYINFO_ORDER_BIGNULL ){
    /* This block runs if reg1 contains a NULL. */
    int addr = sqlite3VdbeAddOp1(v, OP_NotNull, reg1); VdbeCoverage(v);
    switch( op ){
      case OP_Ge:
        sqlite3VdbeAddOp2(v, OP_Goto, 0, lbl);
        break;
      case OP_Gt:
        sqlite3VdbeAddOp2(v, OP_NotNull, reg2, lbl);
        VdbeCoverage(v);
        break;
      case OP_Le:
        sqlite3VdbeAddOp2(v, OP_IsNull, reg2, lbl);
        VdbeCoverage(v);
        break;
      default: assert( op==OP_Lt ); /* no-op */ break;
    }
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrDone);

    /* This block runs if reg1 is not NULL, but reg2 is. */
    sqlite3VdbeJumpHere(v, addr);
    sqlite3VdbeAddOp2(v, OP_IsNull, reg2,
                      (op==OP_Gt || op==OP_Ge) ? addrDone : lbl);
    VdbeCoverage(v);
  }

  /* Register reg1 currently contains csr1.peerVal (the peer-value from csr1).
  ** This block adds (or subtracts for DESC) the numeric value in regVal
  ** from it. Or, if reg1 is not numeric (it is a NULL, a text value or a blob),
  ** then leave reg1 as it is. In pseudo-code, this is implemented as:
  **
  **   if( reg1>='' ) goto addrGe;
  **   reg1 = reg1 +/- regVal
  **   addrGe:
  **
  ** Since all strings and blobs are greater-than-or-equal-to an empty string,
  ** the add/subtract is skipped for these, as required. If reg1 is a NULL,
  ** then the arithmetic is performed, but since adding or subtracting from
  ** NULL is always NULL anyway, this case is handled as required too.  */
  sqlite3VdbeAddOp4(v, OP_String8, 0, regString, 0, "", P4_STATIC);
  addrGe = sqlite3VdbeAddOp3(v, OP_Ge, regString, 0, reg1);
  VdbeCoverage(v);
  if( (op==OP_Ge && arith==OP_Add) || (op==OP_Le && arith==OP_Subtract) ){
    sqlite3VdbeAddOp3(v, op, reg2, lbl, reg1); VdbeCoverage(v);
  }
  sqlite3VdbeAddOp3(v, arith, regVal, reg1, reg1);
  sqlite3VdbeJumpHere(v, addrGe);

  /* Compare registers reg2 and reg1, taking the jump if required. Note that
  ** control skips over this test if the BIGNULL flag is set and either
  ** reg1 or reg2 contain a NULL value.  */
  sqlite3VdbeAddOp3(v, op, reg2, lbl, reg1); VdbeCoverage(v);
  pColl = sqlite3ExprNNCollSeq(pParse, pOrderBy->a[0].pExpr);
  sqlite3VdbeAppendP4(v, (void*)pColl, P4_COLLSEQ);
  sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
  sqlite3VdbeResolveLabel(v, addrDone);

  assert( op==OP_Ge || op==OP_Gt || op==OP_Lt || op==OP_Le );
  testcase(op==OP_Ge); VdbeCoverageIf(v, op==OP_Ge);
  testcase(op==OP_Lt); VdbeCoverageIf(v, op==OP_Lt);
  testcase(op==OP_Le); VdbeCoverageIf(v, op==OP_Le);
  testcase(op==OP_Gt); VdbeCoverageIf(v, op==OP_Gt);
  sqlite3ReleaseTempReg(pParse, reg1);
  sqlite3ReleaseTempReg(pParse, reg2);

  VdbeModuleComment((v, "CodeRangeTest: end"));
}